

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha512.cc
# Opt level: O1

int SHA512_Final(uchar *md,SHA512_CTX *c)

{
  if (md != (uchar *)0x0) {
    BCM_sha512_final(md,(SHA512_CTX *)c);
    return 1;
  }
  return 0;
}

Assistant:

int SHA512_Final(uint8_t out[SHA512_DIGEST_LENGTH], SHA512_CTX *sha) {
  // Historically this function retured failure if passed NULL, even
  // though other final functions do not.
  if (out == NULL) {
    return 0;
  }
  BCM_sha512_final(out, sha);
  return 1;
}